

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.c
# Opt level: O2

void Opal_Sample(Opal *self,int16_t *left,int16_t *right)

{
  undefined8 uVar1;
  short sVar2;
  long lVar3;
  ulong uVar4;
  int16_t iVar5;
  int16_t iVar6;
  int16_t iVar7;
  short sVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t phase_step;
  uint16_t uVar12;
  OpalOperator *pOVar13;
  int16_t in_R9W;
  long lVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  iVar15 = self->SampleRate;
  iVar16 = self->SampleAccum;
  do {
    if (iVar16 < iVar15) {
      lVar14 = ((long)(iVar15 / 2) + (long)iVar16 * 0x10000) / (long)iVar15;
      if (lVar14 < -0x7fffffff) {
        lVar14 = -0x80000000;
      }
      if (0x7ffffffe < lVar14) {
        lVar14 = 0x7fffffff;
      }
      *left = (short)((((int)self->CurrOutput[0] - (int)self->LastOutput[0]) * (int)lVar14) /
                     0x10000) + self->LastOutput[0];
      *right = (short)((((int)self->CurrOutput[1] - (int)self->LastOutput[1]) * (int)lVar14) /
                      0x10000) + self->LastOutput[1];
      self->SampleAccum = iVar16 + 0xc234;
      return;
    }
    *(undefined4 *)self->LastOutput = *(undefined4 *)self->CurrOutput;
    auVar18 = (undefined1  [16])0x0;
    for (lVar14 = 0x5c; lVar14 != 0x5fc; lVar14 = lVar14 + 0x50) {
      if (*(int *)((long)self->LastOutput + lVar14 + -0x14) == 0) {
        iVar15 = 0;
        iVar16 = 0;
      }
      else {
        lVar3 = *(long *)((long)self->LastOutput + lVar14 + -0x34);
        uVar9 = *(ushort *)(lVar3 + 0x1698);
        if ((uVar9 & 3) == 0) {
          uVar10 = 0;
        }
        else {
          uVar11 = ((*(ushort *)((long)self->LastOutput + lVar14 + -0x2c) >> 7 & 7) >>
                   (*(int *)(lVar3 + 0x16a4) == 0)) >> ((byte)uVar9 & 1);
          uVar10 = -uVar11;
          if ((uVar9 & 4) == 0) {
            uVar10 = uVar11;
          }
          uVar10 = uVar10 & 0xffff;
        }
        lVar3 = *(long *)((long)self->LastOutput + lVar14 + -0x1c);
        phase_step = (uint32_t)
                     (short)(uVar10 << (*(byte *)((long)self->LastOutput + lVar14 + -0x2a) & 0x1f));
        if (lVar3 == 0) {
          sVar8 = *(short *)((long)self->LastOutput + lVar14 + -0x20);
          iVar5 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar14 + -0x54),
                                      (uint16_t)
                                      *(undefined4 *)((long)self->LastOutput + lVar14 + -0x28),
                                      phase_step,0,
                                      *(int16_t *)((long)self->LastOutput + lVar14 + -0x22),in_R9W);
          pOVar13 = *(OpalOperator **)((long)self->LastOutput + lVar14 + -0x4c);
          uVar12 = (uint16_t)*(undefined4 *)((long)self->LastOutput + lVar14 + -0x28);
          if (sVar8 != 0) {
            iVar6 = 0;
            goto LAB_0013f6ba;
          }
LAB_0013f739:
          sVar8 = OpalOperator_Output(pOVar13,uVar12,phase_step,iVar5,0,in_R9W);
        }
        else {
          sVar8 = *(short *)(lVar3 + 0x34);
          sVar2 = *(short *)((long)self->LastOutput + lVar14 + -0x20);
          iVar5 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar14 + -0x54),
                                      (uint16_t)
                                      *(undefined4 *)((long)self->LastOutput + lVar14 + -0x28),
                                      phase_step,0,
                                      *(int16_t *)((long)self->LastOutput + lVar14 + -0x22),in_R9W);
          pOVar13 = *(OpalOperator **)((long)self->LastOutput + lVar14 + -0x4c);
          uVar12 = (uint16_t)*(undefined4 *)((long)self->LastOutput + lVar14 + -0x28);
          if (sVar8 == 0) {
            if (sVar2 == 0) {
              iVar5 = OpalOperator_Output(pOVar13,uVar12,phase_step,iVar5,0,in_R9W);
              iVar5 = OpalOperator_Output(*(OpalOperator **)
                                           ((long)self->LastOutput + lVar14 + -0x44),
                                          (uint16_t)
                                          *(undefined4 *)((long)self->LastOutput + lVar14 + -0x28),
                                          phase_step,iVar5,0,in_R9W);
              pOVar13 = *(OpalOperator **)((long)self->LastOutput + lVar14 + -0x3c);
              uVar12 = (uint16_t)*(undefined4 *)((long)self->LastOutput + lVar14 + -0x28);
              goto LAB_0013f739;
            }
            iVar6 = OpalOperator_Output(pOVar13,uVar12,phase_step,0,0,in_R9W);
            iVar6 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar14 + -0x44),
                                        (uint16_t)
                                        *(undefined4 *)((long)self->LastOutput + lVar14 + -0x28),
                                        phase_step,iVar6,0,in_R9W);
            pOVar13 = *(OpalOperator **)((long)self->LastOutput + lVar14 + -0x3c);
            uVar12 = (uint16_t)*(undefined4 *)((long)self->LastOutput + lVar14 + -0x28);
LAB_0013f6ba:
            iVar6 = OpalOperator_Output(pOVar13,uVar12,phase_step,iVar6,0,in_R9W);
            sVar8 = iVar5 + iVar6;
          }
          else if (sVar2 == 0) {
            iVar5 = OpalOperator_Output(pOVar13,uVar12,phase_step,iVar5,0,in_R9W);
            iVar6 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar14 + -0x44),
                                        (uint16_t)
                                        *(undefined4 *)((long)self->LastOutput + lVar14 + -0x28),
                                        phase_step,0,0,in_R9W);
            iVar6 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar14 + -0x3c),
                                        (uint16_t)
                                        *(undefined4 *)((long)self->LastOutput + lVar14 + -0x28),
                                        phase_step,iVar6,0,in_R9W);
            sVar8 = iVar6 + iVar5;
          }
          else {
            iVar6 = OpalOperator_Output(pOVar13,uVar12,phase_step,0,0,in_R9W);
            iVar6 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar14 + -0x44),
                                        (uint16_t)
                                        *(undefined4 *)((long)self->LastOutput + lVar14 + -0x28),
                                        phase_step,iVar6,0,in_R9W);
            iVar7 = OpalOperator_Output(*(OpalOperator **)((long)self->LastOutput + lVar14 + -0x3c),
                                        (uint16_t)
                                        *(undefined4 *)((long)self->LastOutput + lVar14 + -0x28),
                                        phase_step,0,0,in_R9W);
            sVar8 = iVar7 + iVar5 + iVar6;
          }
        }
        uVar1 = *(undefined8 *)((long)self->LastOutput + lVar14 + -0x10);
        uVar10 = *(uint *)((long)self->LastOutput + lVar14 + -8);
        iVar15 = (~-(uint)((int)uVar1 == 0) & (int)sVar8) * (uVar10 & 0xffff);
        iVar16 = (uVar10 >> 0x10) * (~-(uint)((int)((ulong)uVar1 >> 0x20) == 0) & (int)sVar8);
        iVar15 = (int)(((uint)(iVar15 >> 0x1f) >> 0x10) + iVar15) >> 0x10;
        iVar16 = (int)(((uint)(iVar16 >> 0x1f) >> 0x10) + iVar16) >> 0x10;
      }
      auVar17._0_4_ = auVar18._0_4_ + iVar15;
      auVar17._4_4_ = auVar18._4_4_ + iVar16;
      auVar17._8_4_ = auVar18._8_4_;
      auVar17._12_4_ = auVar18._12_4_;
      auVar18 = auVar17;
    }
    auVar18 = packssdw(auVar18,auVar18);
    *(int *)self->CurrOutput = auVar18._0_4_;
    self->Clock = self->Clock + 1;
    uVar4 = (ulong)(self->TremoloClock + 1) % 0x3480;
    self->TremoloClock = (uint16_t)uVar4;
    uVar11 = (uint)uVar4;
    uVar10 = 0x3480 - uVar11;
    if (uVar11 < 0x1a40) {
      uVar10 = uVar11;
    }
    self->TremoloLevel = (uint16_t)(uVar10 >> 8);
    if (self->TremoloDepth == 0) {
      self->TremoloLevel = (uint16_t)(uVar10 >> 10);
    }
    uVar9 = self->VibratoTick + 1;
    self->VibratoTick = uVar9;
    if (0x3ff < uVar9) {
      self->VibratoTick = 0;
      self->VibratoClock = (short)*(undefined4 *)&self->VibratoClock + 1U & 7;
    }
    iVar15 = self->SampleRate;
    iVar16 = self->SampleAccum - iVar15;
    self->SampleAccum = iVar16;
  } while( true );
}

Assistant:

void Opal_Sample(Opal *self, int16_t* left, int16_t* right)
{
    int32_t fract;

    /* If the destination sample rate is higher than the OPL3 sample rate, we need to skip ahead */
    while(self->SampleAccum >= self->SampleRate)
    {
        self->LastOutput[0] = self->CurrOutput[0];
        self->LastOutput[1] = self->CurrOutput[1];

        Opal_Output(self, &self->CurrOutput[0], &self->CurrOutput[1]);

        self->SampleAccum -= self->SampleRate;
    }

    /* Mix with the partial accumulation */
    fract = s_opal_MulDivR(self->SampleAccum, 65536, self->SampleRate);
    *left = (int16_t)(self->LastOutput[0] + ((fract * (self->CurrOutput[0] - self->LastOutput[0])) / 65536));
    *right = (int16_t)(self->LastOutput[1] + ((fract * (self->CurrOutput[1] - self->LastOutput[1])) / 65536));

    self->SampleAccum += OpalOPL3SampleRate;
}